

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iteration_proxy.hpp
# Opt level: O2

void __thiscall
nlohmann::json_abi_v3_11_2::detail::
iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
::~iteration_proxy_value
          (iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           *this)

{
  std::__cxx11::string::~string((string *)&this->empty_str);
  std::__cxx11::string::~string((string *)&this->array_index_str);
  return;
}

Assistant:

~iteration_proxy_value() = default;